

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw_main.cpp
# Opt level: O3

void HandleGLFWError(int error,char *description)

{
  ostream *poVar1;
  size_t sVar2;
  LumeviewError *this;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"GLFW ERROR (code ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,error);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):\n",3);
  if (description == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,description,sVar2);
  }
  this = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  lumeview::LumeviewError::LumeviewError(this,&local_1c0);
  __cxa_throw(this,&lumeview::LumeviewError::typeinfo,lumeview::LumeviewError::~LumeviewError);
}

Assistant:

void HandleGLFWError (int error, const char* description)
{
	THROW ("GLFW ERROR (code " << error << "):\n" <<
	       description);
}